

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O3

void __thiscall tst_benchmark::errorThen(tst_benchmark *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  PromiseDataBase<void,_void_()> *pPVar7;
  PromiseDataBase<void,_void_()> *this_00;
  QPromiseReject<void> *in_R8;
  char *pcVar8;
  QSharedData *pQVar9;
  PromiseResolver<void> resolver_2;
  PromiseResolver<void> resolver_1;
  int value;
  int value_1;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_160;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_158;
  Data *local_150;
  int *local_148;
  QPromise<void> local_140;
  _Any_data local_130;
  QPromiseBase<void> *local_120;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_110;
  QPromiseBase<void> local_108;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_d8;
  int local_cc;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  QSharedData *local_a8;
  _func_int **local_a0;
  function<void_()> local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined4 local_54;
  _Any_data local_50;
  code *local_40;
  
  local_108._vptr_QPromiseBase =
       (_func_int **)CONCAT44(local_108._vptr_QPromiseBase._4_4_,0xffffffff);
  _DAT_00123240 = 0;
  Logger::logs()::logs = 1;
  DAT_00123244._4_4_ = 1;
  local_160.d._0_4_ = 0x2a;
  QtPromise::QPromiseBase<void>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            ((QPromiseBase<void> *)&local_98,(Data_conflict *)&local_160);
  local_98.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122b18;
  pPVar7 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar7->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar7->super_QSharedData = 0;
  (pPVar7->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->m_catchers).d.size = 0;
  (pPVar7->m_handlers).d.size = 0;
  (pPVar7->m_catchers).d.d = (Data *)0x0;
  (pPVar7->m_handlers).d.d = (Data *)0x0;
  (pPVar7->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&pPVar7->m_lock = 0;
  *(undefined8 *)&pPVar7->m_settled = 0;
  (pPVar7->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar7->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122bb8;
  QReadWriteLock::QReadWriteLock(&pPVar7->m_lock,0);
  pQVar9 = &pPVar7->super_QSharedData;
  pPVar7->m_settled = false;
  (pPVar7->m_handlers).d.d = (Data *)0x0;
  (pPVar7->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (pPVar7->m_handlers).d.size = 0;
  (pPVar7->m_catchers).d.d = (Data *)0x0;
  (pPVar7->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->m_catchers).d.size = 0;
  (pPVar7->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar7->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122b50;
  LOCK();
  (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122b18;
  local_f8.super__Function_base._M_functor._8_8_ = pPVar7;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_c8,(QPromise<void> *)&local_f8);
  local_a0 = (_func_int **)&PTR__QPromiseBase_00122958;
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122958;
  if ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_f8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_f8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  uVar4 = local_98.super__Function_base._M_functor._8_8_;
  if ((int *)local_c8._M_unused._0_8_ == (int *)0x0) {
    local_158.d = (Data *)0x0;
LAB_0010c365:
    local_140.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)local_c8._M_unused._0_8_ = *local_c8._M_unused._M_object + 1;
    UNLOCK();
    local_158.d = (Data *)local_c8._M_unused._0_8_;
    if ((int *)local_c8._M_unused._0_8_ == (int *)0x0) goto LAB_0010c365;
    LOCK();
    *(int *)local_c8._M_unused._0_8_ = *local_c8._M_unused._M_object + 1;
    UNLOCK();
    local_140.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)local_c8._M_unused._0_8_;
  }
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_()> *)&local_50,(PromiseHandler<void,decltype(nullptr),void> *)0x0,
             &local_158,(QPromiseResolve<void> *)&local_140,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)uVar4,(function<void_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  uVar4 = local_98.super__Function_base._M_functor._8_8_;
  local_130._M_unused._M_object = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130._8_8_ = local_140.super_QPromiseBase<void>._vptr_QPromiseBase;
  if (local_140.super_QPromiseBase<void>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase =
         *(int *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  local_120 = &local_108;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_130._M_unused._M_object;
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_130._8_8_;
  if ((_func_int **)local_130._8_8_ == (_func_int **)0x0) {
    *(QPromiseBase<void> **)((long)local_78._M_unused._0_8_ + 0x10) = local_120;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
    UNLOCK();
    *(QPromiseBase<void> **)((long)local_78._M_unused._0_8_ + 0x10) = local_120;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if ((_func_int **)local_130._8_8_ != (_func_int **)0x0) {
      LOCK();
      *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_130._8_8_ == 0) {
        operator_delete((void *)local_130._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + -1;
    UNLOCK();
    if (*local_130._M_unused._M_object == 0) {
      operator_delete(local_130._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)uVar4,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_140.super_QPromiseBase<void>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase =
         *(int *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase == 0) {
      operator_delete(local_140.super_QPromiseBase<void>._vptr_QPromiseBase,0x10);
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  if ((int *)local_c8._M_unused._0_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_c8._M_unused._0_8_ = *local_c8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_c8._M_unused._M_object == 0) {
      operator_delete(local_c8._M_unused._M_object,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)
                     local_98.super__Function_base._M_functor._8_8_);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_98.super__Function_base._M_functor._8_8_);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar7);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar7);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar7->_vptr_PromiseDataBase[1])(pPVar7);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar7->_vptr_PromiseDataBase[1])(pPVar7);
  }
  pp_Var3 = local_a0;
  local_98.super__Function_base._M_functor._M_unused._M_object = local_a0;
  if ((PromiseDataBase<void,_void_()> *)local_98.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar9 = (QSharedData *)(local_98.super__Function_base._M_functor._8_8_ + 8);
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_98.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_98.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  DAT_00123244._4_4_ = DAT_00123244._4_4_ + -1;
  cVar6 = QTest::qCompare(Logger::logs()::logs,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x12a);
  if (cVar6 == '\0') {
    return;
  }
  cVar6 = QTest::qCompare(DAT_00123240,1,"Data::logs().copy","1 + 2 * EXCEPT_CALL_COPY_CTOR",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,300);
  if (cVar6 == '\0') {
    return;
  }
  cVar6 = QTest::qCompare((int)DAT_00123244,0,"Data::logs().move","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x12d);
  if (cVar6 == '\0') {
    return;
  }
  cVar6 = QTest::qCompare(DAT_00123244._4_4_,0,"Data::logs().refs","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x12e);
  if (cVar6 == '\0') {
    return;
  }
  pcVar8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
  ;
  cVar6 = QTest::qCompare((int)local_108._vptr_QPromiseBase,0x2a,"value","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x12f);
  if (cVar6 == '\0') {
    return;
  }
  local_cc = -1;
  _DAT_00123240 = 0;
  Logger::logs()::logs = 1;
  DAT_00123244._4_4_ = 1;
  local_54 = 0x2a;
  QtPromise::QPromiseBase<void>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            (&local_108,(Data_conflict *)&local_54);
  local_108._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122b18;
  pPVar7 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar7->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar7->super_QSharedData = 0;
  (pPVar7->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->m_catchers).d.size = 0;
  (pPVar7->m_handlers).d.size = 0;
  (pPVar7->m_catchers).d.d = (Data *)0x0;
  (pPVar7->m_handlers).d.d = (Data *)0x0;
  (pPVar7->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&pPVar7->m_lock = 0;
  *(undefined8 *)&pPVar7->m_settled = 0;
  (pPVar7->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar7->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122bb8;
  QReadWriteLock::QReadWriteLock(&pPVar7->m_lock,0);
  pPVar7->m_settled = false;
  (pPVar7->m_handlers).d.d = (Data *)0x0;
  (pPVar7->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (pPVar7->m_handlers).d.size = 0;
  (pPVar7->m_catchers).d.d = (Data *)0x0;
  (pPVar7->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->m_catchers).d.size = 0;
  (pPVar7->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar7->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122b50;
  LOCK();
  (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_a8 = &pPVar7->super_QSharedData;
  LOCK();
  (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122b18;
  local_f8.super__Function_base._M_functor._8_8_ = pPVar7;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_158,(QPromise<void> *)&local_f8);
  local_f8.super__Function_base._M_functor._M_unused._M_object = pp_Var3;
  if ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar9 = (QSharedData *)(local_f8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_f8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  QVar2.d = local_108.m_d.d;
  if (local_158.d == (Data *)0x0) {
    local_140.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
LAB_0010c7f8:
    local_160.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_140.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)local_158.d;
    if (local_158.d == (Data *)0x0) goto LAB_0010c7f8;
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_160.d = local_158.d;
  }
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_98,(PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_140,
             (QPromiseResolve<void> *)&local_160,(QPromiseReject<void> *)pcVar8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_98);
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  QVar2.d = local_108.m_d.d;
  local_130._M_unused._M_object = local_140.super_QPromiseBase<void>._vptr_QPromiseBase;
  if ((Data *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130._8_8_ = local_160.d;
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_c8._M_unused._M_object = operator_new(0x18);
  *(void **)local_c8._M_unused._0_8_ = local_130._M_unused._M_object;
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_130._8_8_;
  if ((Data *)local_130._8_8_ == (Data *)0x0) {
    pcStack_b0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
    UNLOCK();
    pcStack_b0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_manager;
    if ((Data *)local_130._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_130._8_8_ == 0) {
        operator_delete((void *)local_130._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + -1;
    UNLOCK();
    if (*local_130._M_unused._M_object == 0) {
      operator_delete(local_130._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_160.d,0x10);
    }
  }
  if ((Data *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_140.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_140.super_QPromiseBase<void>._vptr_QPromiseBase,0x10);
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_108.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_108.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122bb8;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  pp_Var3 = local_a0;
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122b50;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar9 = &this_00->super_QSharedData;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_140.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122b18;
  local_140.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_160,&local_140);
  local_140.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var3;
  if (&(local_140.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_140.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_140.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_140.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_160.d == (Data *)0x0) {
    local_110.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_110.d = local_160.d;
    if (local_160.d != (Data *)0x0) {
      LOCK();
      ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_d8.d = local_160.d;
      goto LAB_0010caba;
    }
  }
  local_d8.d = (Data *)0x0;
LAB_0010caba:
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_()> *)&local_130,(PromiseHandler<void,decltype(nullptr),void> *)0x0,
             &local_110,(QPromiseResolve<void> *)&local_d8,(QPromiseReject<void> *)pcVar8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (pPVar7,(function<void_()> *)&local_130);
  if (local_120 != (QPromiseBase<void> *)0x0) {
    (*(code *)local_120)(&local_130,&local_130,__destroy_functor);
  }
  local_158.d = local_110.d;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_150 = local_d8.d;
  if (local_d8.d != (Data *)0x0) {
    LOCK();
    ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148 = &local_cc;
  local_f8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_f8.super__Function_base._M_functor._8_8_ = 0;
  local_f8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_f8._M_invoker = (_Invoker_type)0x0;
  local_f8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(Data **)local_f8.super__Function_base._M_functor._M_unused._0_8_ = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 8) = local_150;
  if (local_150 == (Data *)0x0) {
    *(int **)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_148;
    local_f8._M_invoker =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_invoke;
    local_f8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    (local_150->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_150->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(int **)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = local_148;
    local_f8._M_invoker =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_invoke;
    local_f8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
         ::_M_manager;
    if (local_150 != (Data *)0x0) {
      LOCK();
      (local_150->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_150->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_150->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_150,0x10);
      }
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher(pPVar7,&local_f8);
  if (local_f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f8.super__Function_base._M_manager)
              ((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  if (local_d8.d != (Data *)0x0) {
    LOCK();
    ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_d8.d,0x10);
    }
  }
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (local_160.d != (Data *)0x0) {
    LOCK();
    ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_160.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar7);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(pPVar7);
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  while (bVar5 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  pp_Var3 = local_a0;
  LOCK();
  (local_a8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_a8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_a8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar7->_vptr_PromiseDataBase[1])(pPVar7);
  }
  local_108._vptr_QPromiseBase = pp_Var3;
  if (&(local_108.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar9 = &((local_108.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_108.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_108.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])();
    }
  }
  DAT_00123244._4_4_ = DAT_00123244._4_4_ + -1;
  cVar6 = QTest::qCompare(Logger::logs()::logs,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x13d);
  if (cVar6 != '\0') {
    cVar6 = QTest::qCompare(DAT_00123240,1,"Data::logs().copy","1 + 4 * EXCEPT_CALL_COPY_CTOR",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                            ,0x13f);
    if (cVar6 != '\0') {
      cVar6 = QTest::qCompare((int)DAT_00123244,0,"Data::logs().move","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0x140);
      if ((cVar6 != '\0') &&
         (cVar6 = QTest::qCompare(DAT_00123244._4_4_,0,"Data::logs().refs","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0x141), cVar6 != '\0')) {
        QTest::qCompare(local_cc,0x2a,"value","42",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                        ,0x142);
      }
    }
  }
  return;
}

Assistant:

void tst_benchmark::errorThen()
{
    { // should not copy error on continuation if rejected
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<void>::reject(Data{42})
            .fail([&](const Data& res) {
                value = res.value();
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy,
                 1 + 2 * EXCEPT_CALL_COPY_CTOR); // (initial) copy value in std::exception_ptr
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
    { // should not copy error on continuation if rethrown
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<void>::reject(Data{42})
            .fail([](const Data&) {
                throw;
            })
            .fail([&](const Data& res) {
                value = res.value();
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy,
                 1 + 4 * EXCEPT_CALL_COPY_CTOR); // (initial) copy value in std::exception_ptr
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
}